

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O1

void mbedtls_psa_get_stats(mbedtls_psa_stats_t *stats)

{
  uint uVar1;
  long lVar2;
  
  stats->cache_slots = 0;
  stats->empty_slots = 0;
  stats->external_slots = 0;
  stats->half_filled_slots = 0;
  stats->volatile_slots = 0;
  stats->persistent_slots = 0;
  stats->max_open_internal_key_id = 0;
  stats->max_open_external_key_id = 0;
  lVar2 = 8;
  do {
    if (*(short *)(&global_data.field_0x570 + lVar2) == 0) {
      stats->empty_slots = stats->empty_slots + 1;
    }
    else if (*(int *)(&global_data.field_0x574 + lVar2) == 1) {
      uVar1 = *(uint *)((long)&global_data.key_slots[0].attr.type + lVar2);
      stats->persistent_slots = stats->persistent_slots + 1;
      if (stats->max_open_internal_key_id < uVar1) {
        stats->max_open_internal_key_id = uVar1;
      }
    }
    else if (*(int *)(&global_data.field_0x574 + lVar2) == 0) {
      stats->volatile_slots = stats->volatile_slots + 1;
    }
    else {
      uVar1 = *(uint *)((long)&global_data.key_slots[0].attr.type + lVar2);
      stats->external_slots = stats->external_slots + 1;
      if (stats->max_open_external_key_id < uVar1) {
        stats->max_open_external_key_id = uVar1;
      }
    }
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x608);
  return;
}

Assistant:

void mbedtls_psa_get_stats( mbedtls_psa_stats_t *stats )
{
    psa_key_handle_t key;
    memset( stats, 0, sizeof( *stats ) );
    for( key = 1; key <= PSA_KEY_SLOT_COUNT; key++ )
    {
        const psa_key_slot_t *slot = &global_data.key_slots[key - 1];
        if( ! psa_is_key_slot_occupied( slot ) )
        {
            ++stats->empty_slots;
            continue;
        }
        if( slot->attr.lifetime == PSA_KEY_LIFETIME_VOLATILE )
            ++stats->volatile_slots;
        else if( slot->attr.lifetime == PSA_KEY_LIFETIME_PERSISTENT )
        {
            psa_app_key_id_t id = PSA_KEY_FILE_GET_KEY_ID(slot->attr.id);
            ++stats->persistent_slots;
            if( id > stats->max_open_internal_key_id )
                stats->max_open_internal_key_id = id;
        }
        else
        {
            psa_app_key_id_t id = PSA_KEY_FILE_GET_KEY_ID(slot->attr.id);
            ++stats->external_slots;
            if( id > stats->max_open_external_key_id )
                stats->max_open_external_key_id = id;
        }
    }
}